

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_0::AsyncStreamFd::splicePumpLoop
          (AsyncStreamFd *this,AsyncStreamFd *input,int pipeIn,int pipeOut,uint64_t readSoFar,
          uint64_t limit,size_t bufferedAmount)

{
  _func_int **pp_Var1;
  long lVar2;
  SourceLocation location;
  SourceLocation location_00;
  ssize_t sVar3;
  AsyncInputStream AVar4;
  int iVar5;
  void *pvVar6;
  undefined4 in_register_00000014;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:439:21)>
  *location_01;
  SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:462:21)>
  *location_02;
  size_t __len;
  ArrayDisposer *value;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_00;
  Context *in_stack_00000010;
  ssize_t n;
  uint local_d4;
  ArrayDisposer *local_d0;
  Fault f;
  Context *local_98;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  Fault f_1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_58;
  void *local_50;
  AsyncInputStream local_48;
  uint64_t readSoFar_local;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  local_50 = (void *)CONCAT44(in_register_00000014,pipeIn);
  local_d4 = (uint)readSoFar;
  local_d0 = (ArrayDisposer *)limit;
  readSoFar_local = limit;
  do {
    while (local_98 = in_stack_00000010, in_stack_00000010 != (Context *)0x0) {
      do {
        n = splice(pipeOut,(__off64_t *)0x0,(input->super_OwnedFileDescriptor).fd,(__off64_t *)0x0,
                   0x100000,3);
        if (-1 < n) goto LAB_003e889e;
        iVar5 = kj::_::Debug::getOsErrorNumber(true);
      } while (iVar5 == -1);
      if (iVar5 != 0) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x1b0,iVar5,
                   "n = splice(pipeIn, nullptr, fd, nullptr, MAX_SPLICE_LEN, SPLICE_F_MOVE | SPLICE_F_NONBLOCK)"
                   ,"");
        kj::_::Debug::Fault::fatal(&f);
      }
LAB_003e889e:
      if (n < 1) {
        f.exception = (Exception *)&n;
        if (-1 < n) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[49],unsigned_long&>
                    (&f_1,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x1b5,FAILED,"n < 0",
                     "_kjCondition,\"splice pipe empty before bufferedAmount reached?\", bufferedAmount"
                     ,(DebugComparison<long_&,_int> *)&f,
                     (char (*) [49])"splice pipe empty before bufferedAmount reached?",
                     (unsigned_long *)&local_98);
          kj::_::Debug::Fault::fatal(&f_1);
        }
        UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)&local_58);
        continuationTracePtr =
             kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:439:21)>
             ::anon_class_48_7_4778365b_for_func::operator();
        pp_Var1 = ((SleepHooks *)&((local_58.ptr)->super_PromiseArenaMember).arena)->
                  _vptr_SleepHooks;
        if (pp_Var1 == (_func_int **)0x0 || (ulong)((long)local_58.ptr - (long)pp_Var1) < 0x50) {
          f.exception = (Exception *)input;
          pvVar6 = operator_new(0x400);
          location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:439:21)>
                         *)((long)pvVar6 + 0x3b0);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_2_,void*&>
                    (location_01,&local_58,(anon_class_48_7_4778365b_for_func *)&f,
                     &continuationTracePtr);
          *(void **)((long)pvVar6 + 0x3b8) = pvVar6;
        }
        else {
          ((SleepHooks *)&((local_58.ptr)->super_PromiseArenaMember).arena)->_vptr_SleepHooks =
               (_func_int **)0x0;
          location_01 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:439:21)>
                         *)(local_58.ptr + -5);
          f.exception = (Exception *)input;
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_2_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_2_,void*&>
                    (location_01,&local_58,(anon_class_48_7_4778365b_for_func *)&f,
                     &continuationTracePtr);
          *(_func_int ***)((long)(local_58.ptr + -5) + 8) = pp_Var1;
        }
        f_1.exception = (Exception *)&DAT_0042a172;
        location.function = &DAT_0042a1d1;
        location.fileName = &DAT_0042a172;
        location.lineNumber = 0x58b;
        location.columnNumber = 0x4c;
        intermediate.ptr = (PromiseNode *)location_01;
        kj::_::maybeChain<unsigned_long>
                  ((OwnPromiseNode *)&local_48,(Promise<unsigned_long> *)&intermediate,location);
        AVar4._vptr_AsyncInputStream = local_48._vptr_AsyncInputStream;
        local_48._vptr_AsyncInputStream = (_func_int **)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_48);
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = AVar4._vptr_AsyncInputStream;
        local_38.ptr = (PromiseNode *)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
        this_00 = &local_58;
LAB_003e8c7e:
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_00);
        return (PromiseBase)(PromiseBase)this;
      }
      f.exception = (Exception *)&n;
      in_stack_00000010 = (Context *)((long)local_98 - n);
      if (local_98 < (ulong)n) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<long&,unsigned_long&>&,char_const(&)[40]>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x1b2,FAILED,"n <= bufferedAmount",
                   "_kjCondition,\"splice pipe larger than bufferedAmount?\"",
                   (DebugComparison<long_&,_unsigned_long_&> *)&f,
                   (char (*) [40])"splice pipe larger than bufferedAmount?");
        kj::_::Debug::Fault::fatal(&f_1);
      }
    }
    __len = bufferedAmount - (long)local_d0;
    if (bufferedAmount < local_d0 || __len == 0) {
      f.exception = (Exception *)&readSoFar_local;
      if (__len != 0) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                   ,0x1c1,FAILED,"readSoFar == limit","_kjCondition,",
                   (DebugComparison<unsigned_long_&,_unsigned_long_&> *)&f);
        kj::_::Debug::Fault::fatal(&f_1);
      }
      local_98 = (Context *)0x0;
      value = (ArrayDisposer *)bufferedAmount;
LAB_003e8cf7:
      Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)value);
      return (PromiseBase)(PromiseBase)this;
    }
    if (0xfffff < __len) {
      __len = 0x100000;
    }
    while( true ) {
      in_stack_00000010 =
           (Context *)
           splice(*(int *)((long)local_50 + 0x10),(__off64_t *)0x0,local_d4,(__off64_t *)0x0,__len,3
                 );
      if (-1 < (long)in_stack_00000010) break;
      iVar5 = kj::_::Debug::getOsErrorNumber(true);
      if (iVar5 != -1) {
        if (iVar5 != 0) {
          kj::_::Debug::Fault::Fault
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x1c7,iVar5,
                     "n = splice(input.fd, nullptr, pipeOut, nullptr, kj::min(limit - readSoFar, MAX_SPLICE_LEN), SPLICE_F_MOVE | SPLICE_F_NONBLOCK)"
                     ,"");
          kj::_::Debug::Fault::fatal(&f);
        }
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)&n);
        sVar3 = n;
        continuationTracePtr =
             kj::_::
             SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:462:21)>
             ::anon_class_40_6_95052f75_for_func::operator();
        lVar2 = *(long *)(n + 8);
        if (lVar2 == 0 || (ulong)(n - lVar2) < 0x48) {
          f.exception = (Exception *)input;
          pvVar6 = operator_new(0x400);
          location_02 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:462:21)>
                         *)((long)pvVar6 + 0x3b8);
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_4_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_4_,void*&>
                    (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&n,
                     (anon_class_40_6_95052f75_for_func *)&f,&continuationTracePtr);
          *(void **)((long)pvVar6 + 0x3c0) = pvVar6;
        }
        else {
          *(undefined8 *)(n + 8) = 0;
          location_02 = (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_unix_c__:462:21)>
                         *)(n + -0x48);
          f.exception = (Exception *)input;
          ctor<kj::_::SimpleTransformPromiseNode<void,kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_4_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AsyncStreamFd::splicePumpLoop(kj::(anonymous_namespace)::AsyncStreamFd&,int,int,unsigned_long,unsigned_long,unsigned_long)::_lambda()_4_,void*&>
                    (location_02,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&n,
                     (anon_class_40_6_95052f75_for_func *)&f,&continuationTracePtr);
          *(long *)(sVar3 + -0x40) = lVar2;
        }
        f_1.exception = (Exception *)&DAT_0042a172;
        location_00.function = &DAT_0042a1d1;
        location_00.fileName = &DAT_0042a172;
        location_00.lineNumber = 0x58b;
        location_00.columnNumber = 0x4c;
        intermediate.ptr = (PromiseNode *)location_02;
        kj::_::maybeChain<unsigned_long>
                  ((OwnPromiseNode *)&local_48,(Promise<unsigned_long> *)&intermediate,location_00);
        AVar4._vptr_AsyncInputStream = local_48._vptr_AsyncInputStream;
        local_48._vptr_AsyncInputStream = (_func_int **)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                  ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_48);
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = AVar4._vptr_AsyncInputStream;
        local_38.ptr = (PromiseNode *)0x0;
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&intermediate);
        this_00 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&n;
        goto LAB_003e8c7e;
      }
    }
    value = local_d0;
    if (in_stack_00000010 == (Context *)0x0) goto LAB_003e8cf7;
    local_d0 = (ArrayDisposer *)
               ((long)&in_stack_00000010->file + (long)&local_d0->_vptr_ArrayDisposer);
    readSoFar_local = (uint64_t)local_d0;
  } while( true );
}

Assistant:

Promise<uint64_t> splicePumpLoop(AsyncStreamFd& input, int pipeIn, int pipeOut,
                                   uint64_t readSoFar, uint64_t limit, size_t bufferedAmount) {
    for (;;) {
      while (bufferedAmount > 0) {
        // First flush out whatever is in the pipe buffer.
        ssize_t n;
        KJ_NONBLOCKING_SYSCALL(n = splice(pipeIn, nullptr, fd, nullptr,
            MAX_SPLICE_LEN, SPLICE_F_MOVE | SPLICE_F_NONBLOCK));
        if (n > 0) {
          KJ_ASSERT(n <= bufferedAmount, "splice pipe larger than bufferedAmount?");
          bufferedAmount -= n;
        } else {
          KJ_ASSERT(n < 0, "splice pipe empty before bufferedAmount reached?", bufferedAmount);
          return observer.whenBecomesWritable()
              .then([this, &input, pipeIn, pipeOut, readSoFar, limit, bufferedAmount]() {
            return splicePumpLoop(input, pipeIn, pipeOut, readSoFar, limit, bufferedAmount);
          });
        }
      }

      // Now the pipe buffer is empty, so we can try to read some more.
      {
        if (readSoFar >= limit) {
          // Hit the limit, we're done.
          KJ_ASSERT(readSoFar == limit);
          return readSoFar;
        }

        ssize_t n;
        KJ_NONBLOCKING_SYSCALL(n = splice(input.fd, nullptr, pipeOut, nullptr,
            kj::min(limit - readSoFar, MAX_SPLICE_LEN), SPLICE_F_MOVE | SPLICE_F_NONBLOCK));
        if (n == 0) {
          // EOF.
          return readSoFar;
        } else if (n < 0) {
          // No data available, wait.
          return input.observer.whenBecomesReadable()
              .then([this, &input, pipeIn, pipeOut, readSoFar, limit]() {
            return splicePumpLoop(input, pipeIn, pipeOut, readSoFar, limit, 0);
          });
        }

        readSoFar += n;
        bufferedAmount = n;
      }
    }
  }